

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_member_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  uint32_t uVar1;
  Decoration *pDVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  mapped_type *pmVar6;
  uint *puVar7;
  uint *ts_1;
  TypeID *pTVar8;
  uint32_t local_2c;
  
  uVar1 = (type->type_alias).id;
  if ((uVar1 != 0) &&
     (bVar5 = Compiler::has_extended_decoration
                        (&this->super_Compiler,uVar1,SPIRVCrossDecorationBufferBlockRepacked),
     !bVar5)) {
    pTVar8 = &type->type_alias;
    do {
      type = Variant::get<spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        pTVar8->id);
      uVar1 = (type->type_alias).id;
      if (uVar1 == 0) break;
      pTVar8 = &type->type_alias;
      bVar5 = Compiler::has_extended_decoration
                        (&this->super_Compiler,uVar1,SPIRVCrossDecorationBufferBlockRepacked);
    } while (!bVar5);
  }
  local_2c = index;
  pmVar6 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
  puVar7 = (uint *)(ulong)index;
  ts_1 = puVar7;
  if (puVar7 < (uint *)(pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size
     ) {
    pDVar2 = (pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    ts_1 = (uint *)((long)puVar7 * 0x188);
    sVar3 = pDVar2[(long)puVar7].alias._M_string_length;
    if (sVar3 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = pDVar2[(long)puVar7].alias._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar4,pcVar4 + sVar3);
      return __return_storage_ptr__;
    }
  }
  join<char_const(&)[3],unsigned_int&>
            (__return_storage_ptr__,(spirv_cross *)0x395104,(char (*) [3])&local_2c,ts_1);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_member_name(const SPIRType &type, uint32_t index)
{
	if (type.type_alias != TypeID(0) &&
	    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
	{
		return to_member_name(get<SPIRType>(type.type_alias), index);
	}

	auto &memb = ir.meta[type.self].members;
	if (index < memb.size() && !memb[index].alias.empty())
		return memb[index].alias;
	else
		return join("_m", index);
}